

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool __thiscall
ON_RTree::RemoveRect(ON_RTree *this,ON_RTreeBBox *a_rect,ON__INT_PTR a_id,ON_RTreeNode **a_root)

{
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 aVar1;
  ON_RTreeNode *pOVar2;
  ON_RTreeListNode *pOVar3;
  bool bVar4;
  ON_RTreeListNode *pOVar5;
  long lVar6;
  Blk *blk;
  ON_RTreeNode *pOVar7;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar8;
  Blk *blk_1;
  ON_RTreeListNode *local_38;
  
  local_38 = (ON_RTreeListNode *)0x0;
  bVar4 = RemoveRectRec(this,a_rect,a_id,*a_root,&local_38);
  pOVar3 = local_38;
  if (!bVar4) {
    while (pOVar3 != (ON_RTreeListNode *)0x0) {
      pOVar7 = pOVar3->m_node;
      if (pOVar7->m_count < 1) {
        pOVar5 = pOVar3->m_next;
LAB_005a5e68:
        *(Blk **)&pOVar7->m_level = (this->m_mem_pool).m_nodes;
        (this->m_mem_pool).m_nodes = (Blk *)pOVar7;
      }
      else {
        lVar6 = 0;
        pOVar2 = pOVar7;
        do {
          paVar8 = &pOVar2->m_branch[0].field_1;
          InsertRect(this,&pOVar2->m_branch[0].m_rect,paVar8->m_id,a_root,pOVar7->m_level);
          lVar6 = lVar6 + 1;
          pOVar2 = (ON_RTreeNode *)paVar8;
        } while (lVar6 < pOVar7->m_count);
        pOVar5 = pOVar3->m_next;
        pOVar7 = pOVar3->m_node;
        if (pOVar7 != (ON_RTreeNode *)0x0) goto LAB_005a5e68;
      }
      pOVar3->m_next = (ON_RTreeListNode *)(this->m_mem_pool).m_list_nodes;
      (this->m_mem_pool).m_list_nodes = (Blk *)pOVar3;
      pOVar3 = pOVar5;
    }
    pOVar7 = *a_root;
    if ((pOVar7->m_count == 1) && (0 < pOVar7->m_level)) {
      aVar1 = pOVar7->m_branch[0].field_1;
      *(Blk **)pOVar7 = (this->m_mem_pool).m_nodes;
      (this->m_mem_pool).m_nodes = (Blk *)pOVar7;
      *a_root = (ON_RTreeNode *)aVar1;
    }
  }
  return bVar4;
}

Assistant:

bool ON_RTree::RemoveRect(ON_RTreeBBox* a_rect, ON__INT_PTR a_id, ON_RTreeNode** a_root)
{
  ON_RTreeNode* tempNode;
  ON_RTreeListNode* reInsertList = nullptr;

  if(!RemoveRectRec(a_rect, a_id, *a_root, &reInsertList))
  {
    // Found and deleted a data item
    // Reinsert any branches from eliminated nodes
    while(reInsertList)
    {
      tempNode = reInsertList->m_node;

      for(int index = 0; index < tempNode->m_count; ++index)
      {
        InsertRect(&(tempNode->m_branch[index].m_rect),
                   tempNode->m_branch[index].m_id,
                   a_root,
                   tempNode->m_level);
      }
      
      ON_RTreeListNode* remLNode = reInsertList;
      reInsertList = reInsertList->m_next;
      
      m_mem_pool.FreeNode(remLNode->m_node);
      m_mem_pool.FreeListNode(remLNode);
    }
    
    // Check for redundant root (not leaf, 1 child) and eliminate
    if((*a_root)->m_count == 1 && (*a_root)->IsInternalNode())
    {
      tempNode = (*a_root)->m_branch[0].m_child;
      m_mem_pool.FreeNode(*a_root);
      *a_root = tempNode;
    }
    return false;
  }
  else
  {
    return true;
  }
}